

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void * jx9ExportStdin(jx9_vm *pVm)

{
  SyMemMethods *pSVar1;
  io_private *pIn;
  jx9_vm *pVm_local;
  
  if (pVm->pStdin == (void *)0x0) {
    pVm_local = (jx9_vm *)SyMemBackendAlloc(&pVm->sAllocator,0x38);
    if (pVm_local == (jx9_vm *)0x0) {
      pVm_local = (jx9_vm *)0x0;
    }
    else {
      InitIOPrivate(pVm,&sjx9Stream,(io_private *)pVm_local);
      pSVar1 = (SyMemMethods *)JX9StreamDataInit(pVm,1);
      (pVm_local->sAllocator).pMethods = pSVar1;
      pVm->pStdin = pVm_local;
    }
  }
  else {
    pVm_local = (jx9_vm *)pVm->pStdin;
  }
  return pVm_local;
}

Assistant:

JX9_PRIVATE void * jx9ExportStdin(jx9_vm *pVm)
{
#ifndef JX9_DISABLE_BUILTIN_FUNC
#ifndef JX9_DISABLE_DISK_IO
	if( pVm->pStdin == 0  ){
		io_private *pIn;
		/* Allocate an IO private instance */
		pIn = (io_private *)SyMemBackendAlloc(&pVm->sAllocator, sizeof(io_private));
		if( pIn == 0 ){
			return 0;
		}
		InitIOPrivate(pVm, &sjx9Stream, pIn);
		/* Initialize the handle */
		pIn->pHandle = JX9StreamDataInit(pVm, JX9_IO_STREAM_STDIN);
		/* Install the STDIN stream */
		pVm->pStdin = pIn;
		return pIn;
	}else{
		/* NULL or STDIN */
		return pVm->pStdin;
	}
#else
	return 0;
#endif
#else
	SXUNUSED(pVm); /* cc warning */
	return 0;
#endif
}